

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::IfcRailingType(IfcRailingType *this)

{
  IfcRailingType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcRailingType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00f96be0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>,
             &PTR_construction_vtable_24__00f96d18);
  *(undefined8 *)this = 0xf96ab0;
  *(undefined8 *)&this->field_0x1c0 = 0xf96bc8;
  *(undefined8 *)&this->field_0x88 = 0xf96ad8;
  *(undefined8 *)&this->field_0x98 = 0xf96b00;
  *(undefined8 *)&this->field_0xf0 = 0xf96b28;
  *(undefined8 *)&this->field_0x148 = 0xf96b50;
  *(undefined8 *)&this->field_0x180 = 0xf96b78;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf96ba0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}